

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O3

int zReadValues(FILE *fp,int n,doublecomplex *destination,int perline,int persize)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  char buf [100];
  double local_a8;
  byte local_98 [104];
  
  if (0 < n) {
    iVar4 = 0;
    bVar3 = false;
    do {
      fgets((char *)local_98,100,(FILE *)fp);
      if (0 < perline) {
        uVar7 = 0;
        lVar5 = 0;
        do {
          lVar1 = lVar5 + 1;
          lVar8 = lVar1 * persize;
          bVar2 = local_98[lVar8];
          local_98[lVar8] = 0;
          if (0 < persize) {
            uVar6 = 0;
            do {
              if ((local_98[uVar6 + uVar7] | 0x20) == 100) {
                local_98[uVar6 + uVar7] = 0x45;
              }
              uVar6 = uVar6 + 1;
            } while ((uint)persize != uVar6);
          }
          lVar5 = lVar5 * persize;
          if (bVar3) {
            destination[iVar4].r = local_a8;
            dVar9 = atof((char *)(local_98 + lVar5));
            destination[iVar4].i = dVar9;
            iVar4 = iVar4 + 1;
          }
          else {
            local_a8 = atof((char *)(local_98 + lVar5));
          }
          bVar3 = !bVar3;
          local_98[lVar8] = bVar2;
        } while ((lVar1 < perline) &&
                (uVar7 = (ulong)(uint)((int)uVar7 + persize), lVar5 = lVar1, iVar4 < n));
      }
    } while (iVar4 < n);
  }
  return 0;
}

Assistant:

int zReadValues(FILE *fp, int n, doublecomplex *destination, int perline, int persize)
{
    register int i, j, k, s, pair;
    register double realpart;
    char tmp, buf[100];
    
    i = pair = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    if ( pair == 0 ) {
	  	/* The value is real part */
		realpart = atof(&buf[s]);
		pair = 1;
	    } else {
		/* The value is imaginary part */
	        destination[i].r = realpart;
		destination[i++].i = atof(&buf[s]);
		pair = 0;
	    }
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}